

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall
Js::PolymorphicCallSiteInfo::GetFunction
          (PolymorphicCallSiteInfo *this,uint index,LocalFunctionId *functionId,SourceId *sourceId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SourceId *sourceId_local;
  LocalFunctionId *functionId_local;
  uint index_local;
  PolymorphicCallSiteInfo *this_local;
  
  if (3 < index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3a4,"(index < DynamicProfileInfo::maxPolymorphicInliningSize)",
                                "index < DynamicProfileInfo::maxPolymorphicInliningSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (functionId == (LocalFunctionId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3a5,"(functionId)","functionId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (sourceId == (SourceId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3a6,"(sourceId)","sourceId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DynamicProfileInfo::IsCallSiteNoInfo(this->functionIds[index]);
  if (!bVar2) {
    *functionId = this->functionIds[index];
    *sourceId = this->sourceIds[index];
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool GetFunction(uint index, Js::LocalFunctionId *functionId, Js::SourceId *sourceId)
        {
            Assert(index < DynamicProfileInfo::maxPolymorphicInliningSize);
            Assert(functionId);
            Assert(sourceId);
            if (DynamicProfileInfo::IsCallSiteNoInfo(functionIds[index]))
            {
                return false;
            }
            *functionId = functionIds[index];
            *sourceId = sourceIds[index];
            return true;
        }